

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int local_60;
  
  vRes->nSize = 0;
  if (0 < nNum) {
    uVar6 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar6]);
      uVar6 = uVar6 + 1;
    } while ((uint)nNum != uVar6);
  }
  if (fSticky == 0) {
    local_60 = 0;
  }
  else {
    local_60 = *pNum;
  }
  if (0 < nShift) {
    piVar1 = vRes->pArray;
    uVar6 = 0x20;
    if (nShift < 0x20) {
      uVar6 = (ulong)(uint)nShift;
    }
    uVar5 = 0;
    bVar2 = false;
    do {
      if (fSticky < nNum) {
        iVar3 = 1 << ((byte)uVar5 & 0x1f);
        lVar7 = (long)nNum;
        do {
          if ((bVar2) || (lVar7 <= iVar3)) {
            iVar4 = Gia_ManHashMux(pNew,pShift[uVar5],local_60,piVar1[lVar7 + -1]);
            piVar1[lVar7 + -1] = iVar4;
            if (nNum < iVar3) {
              bVar2 = true;
            }
          }
          else {
            iVar4 = Gia_ManHashMux(pNew,pShift[uVar5],piVar1[(lVar7 + -1) - (long)iVar3],
                                   piVar1[lVar7 + -1]);
            piVar1[lVar7 + -1] = iVar4;
            bVar2 = false;
          }
          lVar7 = lVar7 + -1;
        } while (fSticky < lVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void Cba_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Cba_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[0] : 0;
    int i, j, fShort = 0;
    if ( nShift > 32 )
        nShift = 32;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = nNum-1; j >= fSticky; j-- ) 
        {
            if( fShort || (1<<i) > j ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j-(1<<i)], pRes[j] );
        }
}